

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_is_compressed_image(fitsfile *fptr,int *status)

{
  int iVar1;
  int *in_RSI;
  int *in_RDI;
  int *in_stack_00000050;
  int *in_stack_00000058;
  int in_stack_00000064;
  fitsfile *in_stack_00000068;
  int *in_stack_000000f0;
  fitsfile *in_stack_000000f8;
  int local_4;
  
  if (*in_RSI < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_000000f8,in_stack_000000f0), 0 < iVar1)) {
        return *in_RSI;
      }
    }
    else {
      ffmahd(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000050);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x47c) == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int fits_is_compressed_image(fitsfile *fptr,  /* I - FITS file pointer  */
                 int *status)                 /* IO - error status      */
/*
   Returns TRUE if the CHDU is a compressed image, else returns zero.
*/
{
    if (*status > 0)
        return(0);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        /* rescan header if data structure is undefined */
        if ( ffrdef(fptr, status) > 0)               
            return(*status);
    }

    /*  check if this is a compressed image */
    if ((fptr->Fptr)->compressimg)
         return(1);

    return(0);
}